

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

MaxBroadcastableLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MaxBroadcastableLayerParams>
          (Arena *arena)

{
  MaxBroadcastableLayerParams *pMVar1;
  
  if (arena != (Arena *)0x0) {
    pMVar1 = DoCreateMessage<CoreML::Specification::MaxBroadcastableLayerParams>(arena);
    return pMVar1;
  }
  pMVar1 = (MaxBroadcastableLayerParams *)operator_new(0x18);
  CoreML::Specification::MaxBroadcastableLayerParams::MaxBroadcastableLayerParams
            (pMVar1,(Arena *)0x0,false);
  return pMVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }